

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

BOOL IsValidCodePage(UINT CodePage)

{
  CP_MAPPING *pCVar1;
  undefined4 local_10;
  BOOL retval;
  UINT CodePage_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (CodePage < 4) {
    local_10 = 0;
  }
  else if (CodePage == 65000) {
    local_10 = 0;
  }
  else if (CodePage == 0xfde9) {
    local_10 = 1;
  }
  else {
    pCVar1 = CODEPAGEGetData(CodePage);
    local_10 = (uint)(pCVar1 != (CP_MAPPING *)0x0);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return local_10;
}

Assistant:

BOOL
PALAPI
IsValidCodePage(
    IN UINT CodePage)
{
    BOOL retval = FALSE;

    PERF_ENTRY(IsValidCodePage);
    ENTRY("IsValidCodePage(%d)\n", CodePage );

    switch(CodePage)
    {
    case CP_ACP       : /* fall through */
    case CP_OEMCP      : /* fall through */
    case CP_MACCP      : /* fall through */
    case CP_THREAD_ACP:
        /* 'pseudo code pages' : not valid */
        retval = FALSE;
        break;
    case CP_UTF7:
        /* valid in Win32, but not supported in Rotor */
        retval = FALSE;
        break;
    case CP_UTF8:
        /* valid, but not part of CODEPAGEGetData's tables */
        retval = TRUE;
        break;
    default:
        retval = (NULL != CODEPAGEGetData( CodePage ));
        break;
    }

    LOGEXIT("IsValidCodePage returns BOOL %d\n",retval);
    PERF_EXIT(IsValidCodePage);
    return retval;
}